

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

curl_hash_element * Curl_hash_next_element(curl_hash_iterator *iter)

{
  curl_hash *pcVar1;
  curl_hash_element *he;
  curl_hash *h;
  int i;
  curl_hash_iterator *iter_local;
  
  pcVar1 = iter->hash;
  if (iter->current_element != (curl_llist_element *)0x0) {
    iter->current_element = iter->current_element->next;
  }
  if (iter->current_element == (curl_llist_element *)0x0) {
    for (h._4_4_ = iter->slot_index; h._4_4_ < pcVar1->slots; h._4_4_ = h._4_4_ + 1) {
      if (pcVar1->table[h._4_4_]->head != (curl_llist_element *)0x0) {
        iter->current_element = pcVar1->table[h._4_4_]->head;
        iter->slot_index = h._4_4_ + 1;
        break;
      }
    }
  }
  if (iter->current_element == (curl_llist_element *)0x0) {
    iter->current_element = (curl_llist_element *)0x0;
    iter_local = (curl_hash_iterator *)0x0;
  }
  else {
    iter_local = (curl_hash_iterator *)iter->current_element->ptr;
  }
  return (curl_hash_element *)iter_local;
}

Assistant:

struct curl_hash_element *
Curl_hash_next_element(struct curl_hash_iterator *iter)
{
  int i;
  struct curl_hash *h = iter->hash;

  /* Get the next element in the current list, if any */
  if(iter->current_element)
    iter->current_element = iter->current_element->next;

  /* If we have reached the end of the list, find the next one */
  if(!iter->current_element) {
    for(i = iter->slot_index;i < h->slots;i++) {
      if(h->table[i]->head) {
        iter->current_element = h->table[i]->head;
        iter->slot_index = i+1;
        break;
      }
    }
  }

  if(iter->current_element) {
    struct curl_hash_element *he = iter->current_element->ptr;
    return he;
  }
  else {
    iter->current_element = NULL;
    return NULL;
  }
}